

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O0

void __thiscall
OpenMD::KirkwoodBuff::collectHistograms
          (KirkwoodBuff *this,StuntDouble *sd1,StuntDouble *sd2,int pairIndex)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  reference pvVar3;
  int in_ECX;
  Snapshot *in_RDX;
  Snapshot *in_RSI;
  Vector<double,_3U> *in_RDI;
  double dVar4;
  int whichBin;
  RealType distance;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  bool usePeriodicBoundaryConditions_;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  StuntDouble *in_stack_ffffffffffffff78;
  
  if (in_RSI != in_RDX) {
    SimInfo::getSimParams((SimInfo *)in_RDI->data_[1]);
    bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x15d23b);
    StuntDouble::getPos(in_stack_ffffffffffffff78);
    StuntDouble::getPos(in_stack_ffffffffffffff78);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffff78,
                      (Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    Vector3<double>::Vector3
              ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_RDI);
    if (bVar1) {
      Snapshot::wrapVector(in_RSI,(Vector3d *)in_RDX);
    }
    dVar4 = Vector<double,_3U>::length((Vector<double,_3U> *)0x15d2ae);
    if (dVar4 < in_RDI[0xa8].data_[0] + in_RDI[0xa8].data_[2]) {
      iVar2 = (int)(dVar4 / in_RDI[0xa8].data_[2]);
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI[0xa9].data_ + 1),(long)in_ECX);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar2);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  return;
}

Assistant:

void KirkwoodBuff::collectHistograms(StuntDouble* sd1, StuntDouble* sd2,
                                       int pairIndex) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    // Bins are set to the inner radius of a spherical shell.
    if (distance < (len_ + deltaR_)) {
      int whichBin = static_cast<int>(distance / deltaR_);
      histograms_[pairIndex][whichBin] += 1;
    }
  }